

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O2

ostream * std::operator<<(ostream *stream,pair<int,_int> *data)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,'{');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,data->first);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,data->second);
  std::operator<<(poVar1,'}');
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const vista::pair<Key, T>& data)
{
    stream << '{' << data.first << ',' << data.second << '}';
    return stream;
}